

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O0

void __thiscall Assimp::ASEImporter::BuildCameras(ASEImporter *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  aiCamera **ppaVar5;
  aiCamera *this_00;
  reference pvVar6;
  float local_3c;
  Camera *in;
  aiCamera *out;
  uint i;
  ASEImporter *this_local;
  
  bVar2 = std::vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>::empty
                    (&this->mParser->m_vCameras);
  if (!bVar2) {
    sVar3 = std::vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>::size
                      (&this->mParser->m_vCameras);
    this->pcScene->mNumCameras = (uint)sVar3;
    auVar1 = ZEXT416(this->pcScene->mNumCameras) * ZEXT816(8);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiCamera **)operator_new__(uVar4);
    this->pcScene->mCameras = ppaVar5;
    for (out._4_4_ = 0; out._4_4_ < this->pcScene->mNumCameras; out._4_4_ = out._4_4_ + 1) {
      this_00 = (aiCamera *)operator_new(0x438);
      aiCamera::aiCamera(this_00);
      this->pcScene->mCameras[out._4_4_] = this_00;
      pvVar6 = std::vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>::operator[]
                         (&this->mParser->m_vCameras,(ulong)out._4_4_);
      this_00->mClipPlaneFar = pvVar6->mFar;
      if ((pvVar6->mNear != 0.0) || (NAN(pvVar6->mNear))) {
        local_3c = pvVar6->mNear;
      }
      else {
        local_3c = 0.1;
      }
      this_00->mClipPlaneNear = local_3c;
      this_00->mHorizontalFOV = *(float *)&(pvVar6->super_BaseNode).field_0x154;
      aiString::Set((aiString *)this_00,&(pvVar6->super_BaseNode).mName);
    }
  }
  return;
}

Assistant:

void ASEImporter::BuildCameras()
{
    if (!mParser->m_vCameras.empty())   {
        pcScene->mNumCameras = (unsigned int)mParser->m_vCameras.size();
        pcScene->mCameras = new aiCamera*[pcScene->mNumCameras];

        for (unsigned int i = 0; i < pcScene->mNumCameras;++i)  {
            aiCamera* out = pcScene->mCameras[i] = new aiCamera();
            ASE::Camera& in = mParser->m_vCameras[i];

            // copy members
            out->mClipPlaneFar  = in.mFar;
            out->mClipPlaneNear = (in.mNear ? in.mNear : 0.1f);
            out->mHorizontalFOV = in.mFOV;

            out->mName.Set(in.mName);
        }
    }
}